

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastDecimalToFloatingPoint<duckdb::hugeint_t,double>
               (hugeint_t input,double *result,uint8_t scale)

{
  hugeint_t rhs;
  hugeint_t lhs;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  bool bVar1;
  byte in_CL;
  byte scale_00;
  double *in_RDX;
  int64_t in_RSI;
  duckdb *in_RDI;
  double dVar2;
  double dVar3;
  hugeint_t hVar4;
  hugeint_t input_03;
  hugeint_t mod;
  hugeint_t div;
  hugeint_t power_of_ten;
  int64_t in_stack_ffffffffffffff38;
  hugeint_t *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff50;
  uint64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  hugeint_t *local_58;
  hugeint_t *local_50;
  
  hVar4.upper = in_stack_ffffffffffffff60;
  hVar4.lower = in_stack_ffffffffffffff58;
  scale_00 = in_CL;
  bVar1 = IsRepresentableExactly<duckdb::hugeint_t,double>(hVar4,in_stack_ffffffffffffff50);
  if ((bVar1) || (in_CL == 0)) {
    input_00.upper = in_stack_ffffffffffffff90;
    input_00.lower = in_stack_ffffffffffffff88;
    dVar2 = Cast::Operation<duckdb::hugeint_t,double>(input_00);
    *in_RDX = dVar2 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)in_CL * 8);
  }
  else {
    input_03.upper._0_1_ = in_CL;
    input_03.lower = in_RSI;
    input_03.upper._1_7_ = 0;
    hVar4 = GetPowerOfTen<duckdb::hugeint_t>(in_RDI,input_03,scale_00);
    hugeint_t::hugeint_t(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    hugeint_t::hugeint_t(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_58 = (hugeint_t *)hVar4.lower;
    local_50 = (hugeint_t *)hVar4.upper;
    lhs.upper = in_stack_ffffffffffffff80;
    lhs.lower = in_stack_ffffffffffffff78;
    rhs.upper = in_RSI;
    rhs.lower = (uint64_t)in_RDI;
    GetDivMod<duckdb::hugeint_t>(lhs,rhs,local_50,local_58);
    input_01.upper = in_stack_ffffffffffffff90;
    input_01.lower = in_stack_ffffffffffffff88;
    dVar2 = Cast::Operation<duckdb::hugeint_t,double>(input_01);
    input_02.upper = in_stack_ffffffffffffff90;
    input_02.lower = in_stack_ffffffffffffff88;
    dVar3 = Cast::Operation<duckdb::hugeint_t,double>(input_02);
    *in_RDX = dVar2 + dVar3 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)in_CL * 8);
  }
  return true;
}

Assistant:

bool TryCastDecimalToFloatingPoint(SRC input, DST &result, uint8_t scale) {
	if (IsRepresentableExactly<SRC, DST>(input, DST(0.0)) || scale == 0) {
		// Fast path, integer is representable exaclty as a float/double
		result = Cast::Operation<SRC, DST>(input) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
		return true;
	}
	auto power_of_ten = GetPowerOfTen(input, scale);

	SRC div = 0;
	SRC mod = 0;
	GetDivMod(input, power_of_ten, div, mod);

	result = Cast::Operation<SRC, DST>(div) +
	         Cast::Operation<SRC, DST>(mod) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
	return true;
}